

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall ObjectTest_basic_get_list_Test::TestBody(ObjectTest_basic_get_list_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  AssertHelper local_6c8 [8];
  Message local_6c0 [8];
  list<jessilib::object,_std::allocator<jessilib::object>_> local_6b8;
  list<jessilib::object,_std::allocator<jessilib::object>_> local_698;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_648 [8];
  Message local_640 [8];
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_638;
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_618;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_5c8 [8];
  Message local_5c0 [8];
  list<long_double,_std::allocator<long_double>_> local_5b8;
  list<long_double,_std::allocator<long_double>_> local_598;
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_548 [8];
  Message local_540 [8];
  list<double,_std::allocator<double>_> local_538;
  list<double,_std::allocator<double>_> local_518;
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_4c8 [8];
  Message local_4c0 [8];
  list<float,_std::allocator<float>_> local_4b8;
  list<float,_std::allocator<float>_> local_498;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_448 [8];
  Message local_440 [8];
  list<long,_std::allocator<long>_> local_438;
  list<long,_std::allocator<long>_> local_418;
  bool local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_3c8 [8];
  Message local_3c0 [8];
  list<long_long,_std::allocator<long_long>_> local_3b8;
  list<long_long,_std::allocator<long_long>_> local_398;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_348 [8];
  Message local_340 [8];
  list<long,_std::allocator<long>_> local_338;
  list<long,_std::allocator<long>_> local_318;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2c8 [8];
  Message local_2c0 [8];
  list<int,_std::allocator<int>_> local_2b8;
  list<int,_std::allocator<int>_> local_298;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_248 [8];
  Message local_240 [8];
  list<short,_std::allocator<short>_> local_238;
  list<short,_std::allocator<short>_> local_218;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1c8 [8];
  Message local_1c0 [8];
  list<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  list<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_148 [8];
  Message local_140 [8];
  list<signed_char,_std::allocator<signed_char>_> local_138;
  list<signed_char,_std::allocator<signed_char>_> local_118;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_c8 [8];
  Message local_c0 [24];
  list<bool,_std::allocator<bool>_> local_a8;
  list<bool,_std::allocator<bool>_> local_88;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  object obj;
  ObjectTest_basic_get_list_Test *this_local;
  
  jessilib::object::object((object *)&gtest_ar_.message_);
  local_a8.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_a8.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_a8.super__List_base<bool,_std::allocator<bool>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<bool,_std::allocator<bool>_>::list(&local_a8);
  jessilib::object::
  get<std::__cxx11::list<bool,_std::allocator<bool>_>,_std::__cxx11::list<bool,_std::allocator<bool>_>,_nullptr>
            (&local_88,(object *)&gtest_ar_.message_,&local_a8);
  local_69 = std::__cxx11::list<bool,_std::allocator<bool>_>::empty(&local_88);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  std::__cxx11::list<bool,_std::allocator<bool>_>::~list(&local_88);
  std::__cxx11::list<bool,_std::allocator<bool>_>::~list(&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_68,
               "obj.get<std::list<bool>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=(local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_138.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_138.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_138.super__List_base<signed_char,_std::allocator<signed_char>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::list(&local_138);
  jessilib::object::
  get<std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            (&local_118,(object *)&gtest_ar_.message_,&local_138);
  local_f9 = std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::empty(&local_118);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f8,&local_f9,(type *)0x0)
  ;
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::~list(&local_118);
  std::__cxx11::list<signed_char,_std::allocator<signed_char>_>::~list(&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_f8,
               "obj.get<std::list<signed char>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe5,pcVar2);
    testing::internal::AssertHelper::operator=(local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(local_148);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_1b8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_1b8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_1b8.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl._M_node._M_size
       = 0;
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list(&local_1b8);
  jessilib::object::
  get<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            (&local_198,(object *)&gtest_ar_.message_,&local_1b8);
  local_179 = std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::empty(&local_198);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_178,&local_179,(type *)0x0);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_198);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::~list(&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_178,
               "obj.get<std::list<unsigned char>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe6,pcVar2);
    testing::internal::AssertHelper::operator=(local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_238.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_238.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_238.super__List_base<short,_std::allocator<short>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<short,_std::allocator<short>_>::list(&local_238);
  jessilib::object::
  get<std::__cxx11::list<short,_std::allocator<short>_>,_std::__cxx11::list<short,_std::allocator<short>_>,_nullptr>
            (&local_218,(object *)&gtest_ar_.message_,&local_238);
  local_1f9 = std::__cxx11::list<short,_std::allocator<short>_>::empty(&local_218);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
  std::__cxx11::list<short,_std::allocator<short>_>::~list(&local_218);
  std::__cxx11::list<short,_std::allocator<short>_>::~list(&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_1f8,
               "obj.get<std::list<short>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=(local_248,local_240);
    testing::internal::AssertHelper::~AssertHelper(local_248);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_2b8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_2b8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_2b8.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&local_2b8);
  jessilib::object::
  get<std::__cxx11::list<int,_std::allocator<int>_>,_std::__cxx11::list<int,_std::allocator<int>_>,_nullptr>
            (&local_298,(object *)&gtest_ar_.message_,&local_2b8);
  local_279 = std::__cxx11::list<int,_std::allocator<int>_>::empty(&local_298);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_278,&local_279,(type *)0x0);
  std::__cxx11::list<int,_std::allocator<int>_>::~list(&local_298);
  std::__cxx11::list<int,_std::allocator<int>_>::~list(&local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__5.message_,local_278,
               "obj.get<std::list<int>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=(local_2c8,local_2c0);
    testing::internal::AssertHelper::~AssertHelper(local_2c8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  local_338.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_338.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_338.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&local_338);
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            (&local_318,(object *)&gtest_ar_.message_,&local_338);
  local_2f9 = std::__cxx11::list<long,_std::allocator<long>_>::empty(&local_318);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_318);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__6.message_,local_2f8,
               "obj.get<std::list<long>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=(local_348,local_340);
    testing::internal::AssertHelper::~AssertHelper(local_348);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  local_3b8.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_3b8.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_3b8.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list(&local_3b8);
  jessilib::object::
  get<std::__cxx11::list<long_long,_std::allocator<long_long>_>,_std::__cxx11::list<long_long,_std::allocator<long_long>_>,_nullptr>
            (&local_398,(object *)&gtest_ar_.message_,&local_3b8);
  local_379 = std::__cxx11::list<long_long,_std::allocator<long_long>_>::empty(&local_398);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_378,&local_379,(type *)0x0);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::~list(&local_398);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::~list(&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__7.message_,local_378,
               "obj.get<std::list<long long>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=(local_3c8,local_3c0);
    testing::internal::AssertHelper::~AssertHelper(local_3c8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_438.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_438.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_438.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&local_438);
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            (&local_418,(object *)&gtest_ar_.message_,&local_438);
  local_3f9 = std::__cxx11::list<long,_std::allocator<long>_>::empty(&local_418);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f8,&local_3f9,(type *)0x0);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_418);
  std::__cxx11::list<long,_std::allocator<long>_>::~list(&local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__8.message_,local_3f8,
               "obj.get<std::list<intmax_t>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=(local_448,local_440);
    testing::internal::AssertHelper::~AssertHelper(local_448);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  local_4b8.super__List_base<float,_std::allocator<float>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_4b8.super__List_base<float,_std::allocator<float>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_4b8.super__List_base<float,_std::allocator<float>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<float,_std::allocator<float>_>::list(&local_4b8);
  jessilib::object::
  get<std::__cxx11::list<float,_std::allocator<float>_>,_std::__cxx11::list<float,_std::allocator<float>_>,_nullptr>
            (&local_498,(object *)&gtest_ar_.message_,&local_4b8);
  local_479 = std::__cxx11::list<float,_std::allocator<float>_>::empty(&local_498);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_478,&local_479,(type *)0x0);
  std::__cxx11::list<float,_std::allocator<float>_>::~list(&local_498);
  std::__cxx11::list<float,_std::allocator<float>_>::~list(&local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(local_4c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__9.message_,local_478,
               "obj.get<std::list<float>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=(local_4c8,local_4c0);
    testing::internal::AssertHelper::~AssertHelper(local_4c8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  local_538.super__List_base<double,_std::allocator<double>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)0x0;
  local_538.super__List_base<double,_std::allocator<double>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  local_538.super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<double,_std::allocator<double>_>::list(&local_538);
  jessilib::object::
  get<std::__cxx11::list<double,_std::allocator<double>_>,_std::__cxx11::list<double,_std::allocator<double>_>,_nullptr>
            (&local_518,(object *)&gtest_ar_.message_,&local_538);
  local_4f9 = std::__cxx11::list<double,_std::allocator<double>_>::empty(&local_518);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
  std::__cxx11::list<double,_std::allocator<double>_>::~list(&local_518);
  std::__cxx11::list<double,_std::allocator<double>_>::~list(&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(local_540);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__10.message_,local_4f8,
               "obj.get<std::list<double>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=(local_548,local_540);
    testing::internal::AssertHelper::~AssertHelper(local_548);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_5b8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_5b8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_5b8.super__List_base<long_double,_std::allocator<long_double>_>._M_impl._M_node._M_size = 0;
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::list(&local_5b8);
  jessilib::object::
  get<std::__cxx11::list<long_double,_std::allocator<long_double>_>,_std::__cxx11::list<long_double,_std::allocator<long_double>_>,_nullptr>
            (&local_598,(object *)&gtest_ar_.message_,&local_5b8);
  local_579 = std::__cxx11::list<long_double,_std::allocator<long_double>_>::empty(&local_598);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_578,&local_579,(type *)0x0);
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::~list(&local_598);
  std::__cxx11::list<long_double,_std::allocator<long_double>_>::~list(&local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__11.message_,local_578,
               "obj.get<std::list<long double>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=(local_5c8,local_5c0);
    testing::internal::AssertHelper::~AssertHelper(local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  local_638.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_638.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_638.
  super__List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::list(&local_638);
  jessilib::object::
  get<std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            (&local_618,(object *)&gtest_ar_.message_,&local_638);
  local_5f9 = std::__cxx11::
              list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ::empty(&local_618);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~list(&local_618);
  std::__cxx11::
  list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~list(&local_638);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(local_640);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__12.message_,local_5f8,
               "obj.get<std::list<std::u8string>>().empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=(local_648,local_640);
    testing::internal::AssertHelper::~AssertHelper(local_648);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  local_6b8.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_6b8.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_6b8.super__List_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl._M_node.
  _M_size = 0;
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::list(&local_6b8);
  jessilib::object::
  get<std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            (&local_698,(object *)&gtest_ar_.message_,&local_6b8);
  local_679 = std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::empty
                        (&local_698);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_678,&local_679,(type *)0x0);
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::~list(&local_698);
  std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>::~list(&local_6b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(local_6c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_6e8,local_678,"obj.get<std::list<object>>().empty()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_6e8);
    testing::internal::AssertHelper::AssertHelper
              (local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=(local_6c8,local_6c0);
    testing::internal::AssertHelper::~AssertHelper(local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
    testing::Message::~Message(local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  jessilib::object::~object((object *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_list) {
	object obj;

	EXPECT_TRUE(obj.get<std::list<bool>>().empty());
	EXPECT_TRUE(obj.get<std::list<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::list<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::list<short>>().empty());
	EXPECT_TRUE(obj.get<std::list<int>>().empty());
	EXPECT_TRUE(obj.get<std::list<long>>().empty());
	EXPECT_TRUE(obj.get<std::list<long long>>().empty());
	EXPECT_TRUE(obj.get<std::list<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::list<float>>().empty());
	EXPECT_TRUE(obj.get<std::list<double>>().empty());
	EXPECT_TRUE(obj.get<std::list<long double>>().empty());
	EXPECT_TRUE(obj.get<std::list<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::list<object>>().empty());
}